

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alldiff.cpp
# Opt level: O2

bool __thiscall AllDiffBoundsImp<0>::filterlower(AllDiffBoundsImp<0> *this)

{
  int i;
  int iVar1;
  int *piVar2;
  int *piVar3;
  int *piVar4;
  IntVar *pIVar5;
  bool bVar6;
  int k;
  int i_00;
  int iVar7;
  uint uVar8;
  Lit LVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  Lit *pLVar14;
  interval *piVar15;
  int l_2;
  long lVar16;
  int l_1;
  long lVar18;
  int i_01;
  int *piVar19;
  int l;
  int iVar20;
  long lVar21;
  int iVar22;
  int iVar23;
  int *piVar24;
  anon_union_8_2_743a5d44_for_Reason_0 local_a0;
  interval *piVar17;
  
  piVar19 = this->bounds;
  piVar2 = this->t;
  piVar3 = this->h;
  piVar24 = this->d;
  piVar4 = this->bucket;
  for (lVar21 = 1; lVar21 <= (long)this->nb + 1; lVar21 = lVar21 + 1) {
    iVar11 = piVar19[lVar21];
    iVar23 = (int)lVar21 + -1;
    piVar3[lVar21] = iVar23;
    piVar2[lVar21] = iVar23;
    piVar24[lVar21] = iVar11 - piVar19[lVar21 + -1];
    piVar4[lVar21] = -1;
  }
  lVar21 = 0;
  do {
    iVar11 = this->sz;
    if (iVar11 <= lVar21) {
      return true;
    }
    piVar15 = this->iv;
    piVar2 = this->maxsorted;
    iVar23 = piVar2[lVar21];
    i = piVar15[iVar23].minrank;
    iVar1 = piVar15[iVar23].maxrank;
    piVar3 = this->t;
    i_00 = pathmax(piVar3,i);
    iVar22 = piVar3[i_00];
    piVar4 = this->bucket;
    piVar15[iVar23].next = piVar4[i_00];
    piVar4[i_00] = piVar2[lVar21];
    piVar24 = piVar24 + i_00;
    *piVar24 = *piVar24 + -1;
    if (*piVar24 == 0) {
      piVar3[i_00] = i_00 + 1;
      i_00 = pathmax(piVar3,i_00);
      piVar3[i_00] = iVar22;
    }
    iVar23 = i + 1;
    while (iVar23 != i_00) {
      iVar7 = piVar3[iVar23];
      piVar3[iVar23] = i_00;
      iVar23 = iVar7;
    }
    if (i < this->h[i]) {
      iVar7 = pathmax(this->h,(int)this);
      lVar18 = (long)iVar7;
      iVar23 = piVar19[lVar18];
      lVar12 = (long)iVar23;
      if (so.lazy == true) {
        iVar10 = piVar19[i];
        lVar13 = lVar18;
        iVar20 = iVar23;
        while (iVar10 < iVar20) {
          piVar17 = (interval *)(piVar4 + lVar13);
          while (lVar16 = (long)piVar17->next, -1 < lVar16) {
            piVar17 = piVar15 + lVar16;
            if (piVar15[lVar16].min < iVar10) {
              iVar10 = piVar15[lVar16].min;
            }
          }
          lVar16 = lVar13 + -1;
          lVar13 = lVar13 + -1;
          iVar20 = piVar19[lVar16];
        }
        local_a0._pt = Reason_new((iVar23 - iVar10) * 2 + 3);
        pIVar5 = this->x[this->maxsorted[lVar21]].var;
        uVar8 = (*(pIVar5->super_Var).super_Branching._vptr_Branching[0xd])(pIVar5,(long)iVar10,2);
        pLVar14 = Clause::operator[](local_a0._pt,1);
        pLVar14->x = uVar8 ^ 1;
        iVar20 = 3;
        for (; piVar19 = this->bounds, iVar10 < piVar19[lVar18]; lVar18 = lVar18 + -1) {
          piVar15 = (interval *)(this->bucket + lVar18);
          while (lVar13 = (long)piVar15->next, -1 < lVar13) {
            pIVar5 = this->x[lVar13].var;
            uVar8 = (*(pIVar5->super_Var).super_Branching._vptr_Branching[0xd])
                              (pIVar5,(long)iVar10,2);
            i_01 = iVar20 + 1;
            pLVar14 = Clause::operator[](local_a0._pt,iVar20);
            pLVar14->x = uVar8 ^ 1;
            pIVar5 = this->x[lVar13].var;
            uVar8 = (*(pIVar5->super_Var).super_Branching._vptr_Branching[0xd])
                              (pIVar5,lVar12 + -1,3);
            iVar20 = iVar20 + 2;
            pLVar14 = Clause::operator[](local_a0._pt,i_01);
            pLVar14->x = uVar8 ^ 1;
            piVar15 = this->iv + lVar13;
          }
        }
      }
      else {
        local_a0._pt = (Clause *)0x0;
      }
      if (sat.assigns.data[(uint)(this->b).v] == '\0') {
        pIVar5 = this->x[this->maxsorted[lVar21]].var;
        if ((pIVar5->max).v < iVar23) {
          iVar11 = (*(pIVar5->super_Var).super_Branching._vptr_Branching[0xd])(pIVar5,lVar12,2);
          pLVar14 = Clause::operator[]((Clause *)local_a0,2);
          pLVar14->x = iVar11;
          bVar6 = BoolView::setVal(&this->b,false,(Reason)local_a0);
          return bVar6;
        }
      }
      else {
        LVar9 = BoolView::getValLit(&this->b);
        pLVar14 = Clause::operator[]((Clause *)local_a0,2);
        pLVar14->x = LVar9.x;
        pIVar5 = this->x[this->maxsorted[lVar21]].var;
        iVar10 = (*(pIVar5->super_Var).super_Branching._vptr_Branching[0xe])
                           (pIVar5,lVar12,local_a0,1);
        if ((char)iVar10 == '\0') {
          return iVar11 <= lVar21;
        }
        piVar24 = this->maxsorted;
        this->iv[piVar24[lVar21]].min = iVar23;
        if (iVar23 < ((this->x[piVar24[lVar21]].var)->min).v) {
          Propagator::pushInQueue(&this->super_Propagator);
        }
        piVar24 = this->h;
        while (i != iVar7) {
          iVar11 = piVar24[i];
          piVar24[i] = iVar7;
          i = iVar11;
        }
        piVar19 = this->bounds;
      }
    }
    piVar24 = this->d;
    if (piVar24[i_00] == piVar19[i_00] - piVar19[iVar1]) {
      piVar2 = this->h;
      iVar22 = iVar22 + -1;
      iVar11 = piVar2[iVar1];
      while (iVar11 != iVar22) {
        iVar23 = piVar2[iVar11];
        piVar2[iVar11] = iVar1;
        iVar11 = iVar23;
      }
      piVar2[iVar1] = iVar22;
    }
    lVar21 = lVar21 + 1;
  } while( true );
}

Assistant:

bool filterlower() {
		int i;
		int j;
		int w;
		int z;

		// fprintf(stderr, "AllDiffBounds::filterlower()\n");
		for (i = 1; i <= nb + 1; i++) {
			d[i] = bounds[i] - bounds[t[i] = h[i] = i - 1];
			bucket[i] = -1;  // this could perhaps be avoided
		}
		for (i = 0; i < sz; i++) {  // visit intervals in increasing max order
			const int minrank = iv[maxsorted[i]].minrank;
			const int maxrank = iv[maxsorted[i]].maxrank;
			// fprintf(stderr, "var %d [%d, %d)\n", maxsorted[i], bounds[minrank], bounds[maxrank]);
			j = t[z = pathmax(t, minrank + 1)];
			iv[maxsorted[i]].next = bucket[z];
			bucket[z] = maxsorted[i];
			if (--d[z] == 0) {
				t[z = pathmax(t, t[z] = z + 1)] = j;
			}
			pathset(t, minrank + 1, z, z);  // path compression
			// if (d[z] < bounds[z]-bounds[maxrank]) return false; // no solution
			if (h[minrank] > minrank) {
				Clause* r = nullptr;
				const int hall_max = bounds[w = pathmax(h, h[minrank])];
				if (so.lazy) {
					int hall_min = bounds[minrank];
					// here both k and hall_min are decreasing, stop when k catches up
					for (int k = w; bounds[k] > hall_min; --k) {
						for (int l = bucket[k]; l >= 0; l = iv[l].next) {
							hall_min = std::min(hall_min, iv[l].min);
						}
					}
					// fprintf(stderr, "  in hall [%d, %d):\n", hall_min, hall_max);
					r = Reason_new(3 + (hall_max - hall_min) * 2);
					(*r)[1] = ~x[maxsorted[i]].getLit(hall_min, LR_GE);
					int m = 3;
					for (int k = w; bounds[k] > hall_min; --k) {
						for (int l = bucket[k]; l >= 0; l = iv[l].next) {
							// fprintf(stderr, "    var %d [%d, %d)\n", l, iv[l].min, iv[l].max);
							(*r)[m++] = ~x[l].getLit(hall_min, LR_GE);
							(*r)[m++] = ~x[l].getLit(hall_max - 1, LR_LE);
						}
					}
					assert(m == 3 + (hall_max - hall_min) * 2);
				}
				if (b.isFixed()) {
					assert(b.isTrue());
					(*r)[2] = b.getValLit();
					if (!x[maxsorted[i]].setMin(hall_max, r)) {
						// fprintf(stderr, "  failure\n");
						return false;
					}
					iv[maxsorted[i]].min = hall_max;
					if (x[maxsorted[i]].getMin() > hall_max) {
						// fprintf(stderr, "  hole, var %d [%d, %d)\n", maxsorted[i],
						// static_cast<int>(x[maxsorted[i]].getMin()), iv[maxsorted[i]].max);
						pushInQueue();  // hole in domain
					}
					pathset(h, minrank, w, w);  // path compression
				} else {
					if (x[maxsorted[i]].getMax() < hall_max) {
						(*r)[2] = x[maxsorted[i]].getLit(hall_max, LR_GE);
						return b.setVal(false, r);
					}
				}
			}
			if (d[z] == bounds[z] - bounds[maxrank]) {
				// fprintf(stderr, "  new hall [%d, %d)\n", bounds[j], bounds[maxrank]);
				pathset(h, h[maxrank], j - 1, maxrank);  // mark hall interval
				h[maxrank] = j - 1;
			}
		}
		return true;
	}